

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grow_one_util.cpp
# Opt level: O1

void __thiscall Structure::mark_start_residue(Structure *this,int start)

{
  undefined8 *puVar1;
  Atom *pAVar2;
  Residue *pRVar3;
  long lVar4;
  long lVar5;
  
  pRVar3 = this->_res;
  pAVar2 = pRVar3[start]._atom;
  pAVar2[2].super_Point.z = 0.0;
  pAVar2[2].super_Point.x = 0.0;
  pAVar2[2].super_Point.y = 0.0;
  pAVar2 = pRVar3[start]._atom;
  pAVar2[3].super_Point.z = 0.0;
  pAVar2[3].super_Point.x = 0.0;
  pAVar2[3].super_Point.y = 0.0;
  if (pRVar3[start]._type != 5) {
    pRVar3 = pRVar3 + start;
    pAVar2 = pRVar3->_atom;
    pAVar2[5].super_Point.x = 0.0;
    pAVar2[5].super_Point.y = 0.0;
    pAVar2[5].super_Point.z = 0.0;
    if (6 < pRVar3->_numAtom) {
      lVar4 = 6;
      lVar5 = 0x1e0;
      do {
        pAVar2 = pRVar3->_atom;
        puVar1 = (undefined8 *)((long)&(pAVar2->super_Point).x + lVar5);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&(pAVar2->super_Point).z + lVar5) = 0;
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x50;
      } while (lVar4 < pRVar3->_numAtom);
    }
  }
  return;
}

Assistant:

void Structure::mark_start_residue(const int start) {
    // For start residue, N and CA are known
    Residue& start_res = this->_res[start];
    start_res._atom[ATM_C].move_to_origin();
    start_res._atom[ATM_O].move_to_origin();
    if (start_res._type != GLY) {
        start_res._atom[ATM_CB].move_to_origin();
        for (int iAtom=NUM_BB_ATOM; iAtom < start_res._numAtom; ++iAtom) {
            start_res._atom[iAtom].move_to_origin();
        }
    }
}